

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::MeshLoader::loadPositionsSourceElement(MeshLoader *this,InputShared *input)

{
  bool bVar1;
  Semantic *pSVar2;
  ostream *poVar3;
  String *pSVar4;
  BaseArrayElement<float> *this_00;
  ArrayPrimitiveType<float> *this_01;
  BaseArrayElement<double> *this_02;
  ArrayPrimitiveType<double> *this_03;
  MeshVertexData *pMVar5;
  size_t sVar6;
  InputUnshared *in_RSI;
  long in_RDI;
  size_t initialIndex_1;
  MeshVertexData *positions_1;
  ArrayPrimitiveType<double> *valuesArray_1;
  DoubleArrayElement *arrayElement_1;
  DoubleSource *source_1;
  size_t initialIndex;
  MeshVertexData *positions;
  ArrayPrimitiveType<float> *valuesArray;
  FloatArrayElement *arrayElement;
  FloatSource *source;
  DataType *dataType;
  SourceBase *sourceBase;
  String sourceId;
  URI inputUrl;
  Semantic semantic;
  FloatOrDoubleArray *in_stack_fffffffffffffda8;
  URI *in_stack_fffffffffffffdb0;
  SourceBase *in_stack_fffffffffffffdb8;
  FloatOrDoubleArray *in_stack_fffffffffffffdc0;
  SourceArrayLoader *in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffe37;
  URI *in_stack_fffffffffffffe38;
  URI *this_04;
  int local_154;
  int *local_150;
  undefined4 local_144;
  Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> *local_140;
  string local_128 [32];
  URI local_108;
  Semantic local_1c;
  InputUnshared *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  pSVar2 = InputUnshared::getSemantic(in_RSI);
  local_1c = *pSVar2;
  if (local_1c != POSITION) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "The current input element is not a POSITION element!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
    goto LAB_00c4f15b;
  }
  InputUnshared::getSource(local_18);
  this_04 = &local_108;
  COLLADABU::URI::URI(this_04,in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37);
  pSVar4 = COLLADABU::URI::getFragment_abi_cxx11_(this_04);
  std::__cxx11::string::string(local_128,(string *)pSVar4);
  local_140 = (Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2>
               *)SourceArrayLoader::getSourceById
                           (in_stack_fffffffffffffdc8,(String *)in_stack_fffffffffffffdc0);
  if (local_140 ==
      (Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> *)0x0)
  {
    local_1 = 0;
  }
  else {
    bVar1 = SourceBase::isLoadedInputElement
                      ((SourceBase *)in_stack_fffffffffffffdc8,(Semantic *)in_stack_fffffffffffffdc0
                      );
    if (bVar1) {
      local_1 = 0;
    }
    else {
      local_154 = (*(local_140->super_SourceBase)._vptr_SourceBase[2])();
      local_150 = &local_154;
      if (local_154 == 2) {
        this_00 = Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2>
                  ::getArrayElement(local_140);
        this_01 = BaseArrayElement<float>::getValues(this_00);
        pMVar5 = COLLADAFW::Mesh::getPositions(*(Mesh **)(in_RDI + 0xa0));
        sVar6 = COLLADAFW::FloatOrDoubleArray::getValuesCount(in_stack_fffffffffffffda8);
        SourceBase::setInitialIndex(&local_140->super_SourceBase,sVar6);
        COLLADAFW::FloatOrDoubleArray::setType(&pMVar5->super_FloatOrDoubleArray,DATA_TYPE_FLOAT);
        if (sVar6 == 0) {
          COLLADAFW::ArrayPrimitiveType<float>::getData(this_01);
          COLLADAFW::ArrayPrimitiveType<float>::getCount(this_01);
          COLLADAFW::FloatOrDoubleArray::setData
                    (in_stack_fffffffffffffdc0,(float *)in_stack_fffffffffffffdb8,
                     (size_t)in_stack_fffffffffffffdb0);
          COLLADAFW::ArrayPrimitiveType<float>::yieldOwnerShip(this_01);
        }
        else {
          COLLADAFW::MeshVertexData::appendValues
                    ((MeshVertexData *)in_stack_fffffffffffffdb0,
                     (FloatArray *)in_stack_fffffffffffffda8);
        }
        SourceBase::addLoadedInputElement
                  (in_stack_fffffffffffffdb8,(Semantic *)in_stack_fffffffffffffdb0);
      }
      else {
        if (local_154 != 3) {
          in_stack_fffffffffffffdb0 =
               (URI *)std::operator<<((ostream *)&std::cerr,
                                      "Position source has an other datatype as float or double! ");
          poVar3 = (ostream *)
                   std::ostream::operator<<((ostream *)in_stack_fffffffffffffdb0,*local_150);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          local_1 = 0;
          goto LAB_00c4f130;
        }
        this_02 = Source<COLLADASaxFWL::BaseArrayElement<double>,_(COLLADASaxFWL::SourceBase::DataType)3>
                  ::getArrayElement((Source<COLLADASaxFWL::BaseArrayElement<double>,_(COLLADASaxFWL::SourceBase::DataType)3>
                                     *)local_140);
        this_03 = BaseArrayElement<double>::getValues(this_02);
        pMVar5 = COLLADAFW::Mesh::getPositions(*(Mesh **)(in_RDI + 0xa0));
        sVar6 = COLLADAFW::FloatOrDoubleArray::getValuesCount(in_stack_fffffffffffffda8);
        SourceBase::setInitialIndex(&local_140->super_SourceBase,sVar6);
        COLLADAFW::FloatOrDoubleArray::setType(&pMVar5->super_FloatOrDoubleArray,DATA_TYPE_DOUBLE);
        if (sVar6 == 0) {
          COLLADAFW::ArrayPrimitiveType<double>::getData(this_03);
          in_stack_fffffffffffffdb8 =
               (SourceBase *)COLLADAFW::ArrayPrimitiveType<double>::getCount(this_03);
          COLLADAFW::FloatOrDoubleArray::setData
                    (&pMVar5->super_FloatOrDoubleArray,(double *)in_stack_fffffffffffffdb8,
                     (size_t)in_stack_fffffffffffffdb0);
          COLLADAFW::ArrayPrimitiveType<double>::yieldOwnerShip(this_03);
        }
        else {
          COLLADAFW::MeshVertexData::appendValues
                    ((MeshVertexData *)in_stack_fffffffffffffdb0,
                     (DoubleArray *)in_stack_fffffffffffffda8);
        }
        SourceBase::addLoadedInputElement
                  (in_stack_fffffffffffffdb8,(Semantic *)in_stack_fffffffffffffdb0);
      }
      local_1 = 1;
    }
  }
LAB_00c4f130:
  local_144 = 1;
  std::__cxx11::string::~string(local_128);
  COLLADABU::URI::~URI(in_stack_fffffffffffffdb0);
LAB_00c4f15b:
  return (bool)(local_1 & 1);
}

Assistant:

bool MeshLoader::loadPositionsSourceElement ( const InputShared& input )
    {
        // Get the semantic of the current input element.
        InputSemantic::Semantic semantic = input.getSemantic ();
        if ( semantic != InputSemantic::POSITION )
        {
            std::cerr << "The current input element is not a POSITION element!" << std::endl;
            return false;
        }

        // Get the source element with the uri of the input element.
        COLLADABU::URI inputUrl = input.getSource ();
        String sourceId = inputUrl.getFragment ();
        SourceBase* sourceBase = getSourceById ( sourceId );
        if ( sourceBase == 0 ) return false;
        
        // Check if the source element is already loaded.
        if ( sourceBase->isLoadedInputElement ( semantic ) ) return false;

        // Get the source input array
        const SourceBase::DataType& dataType = sourceBase->getDataType ();
        switch ( dataType )
        {
        case SourceBase::DATA_TYPE_FLOAT:
            {
                // Get the values array from the source
                FloatSource* source = ( FloatSource* ) sourceBase;
                FloatArrayElement& arrayElement = source->getArrayElement ();
                COLLADAFW::ArrayPrimitiveType<float>& valuesArray = arrayElement.getValues ();

                // TODO
                /* unsigned long long stride = source->getStride (); */ /* UNUSED */

                // Check if there are already some values in the positions list.
                // If so, we have to store the last index to increment the following indexes.
                COLLADAFW::MeshVertexData& positions = mMesh->getPositions ();
                const size_t initialIndex = positions.getValuesCount ();
                sourceBase->setInitialIndex ( initialIndex );

                // Push the new positions into the list of positions.
                positions.setType ( COLLADAFW::MeshVertexData::DATA_TYPE_FLOAT );
                if ( initialIndex != 0 ) 
				{
					positions.appendValues ( valuesArray );
				}
                else
				{
					positions.setData ( valuesArray.getData (), valuesArray.getCount () );
					valuesArray.yieldOwnerShip();
				}

                // Set the source base as loaded element.
                sourceBase->addLoadedInputElement ( semantic );

                break;
            }
        case SourceBase::DATA_TYPE_DOUBLE:
            {
                // Get the values array from the source
                DoubleSource* source = ( DoubleSource* ) sourceBase;
                DoubleArrayElement& arrayElement = source->getArrayElement ();
                COLLADAFW::ArrayPrimitiveType<double>& valuesArray = arrayElement.getValues ();

                // Check if there are already some values in the positions list.
                // If so, we have to store the last index to increment the following indexes.
                COLLADAFW::MeshVertexData& positions = mMesh->getPositions ();
                const size_t initialIndex = positions.getValuesCount ();
                sourceBase->setInitialIndex ( initialIndex );

                // Push the new positions into the list of positions.
                positions.setType ( COLLADAFW::MeshVertexData::DATA_TYPE_DOUBLE );
                if ( initialIndex != 0 ) 
				{
					positions.appendValues ( valuesArray );
				}
                else 
				{
					positions.setData ( valuesArray.getData (), valuesArray.getCount () );
					valuesArray.yieldOwnerShip();
				}
                
                // Set the source base as loaded element.
                sourceBase->addLoadedInputElement ( semantic );

                break;
            }
        default:
            std::cerr << "Position source has an other datatype as float or double! " << dataType << std::endl;
            return false;
        }

        return true;
    }